

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O0

void handle_unexpected_msg(atom_server as,char *msg)

{
  long lVar1;
  undefined8 *puVar2;
  int iVar3;
  ulong uVar4;
  char *in_RSI;
  long in_RDI;
  send_get_atom_msg_ptr atom_entry_1;
  send_get_atom_msg_ptr atom_entry;
  int atom;
  char *str;
  Tcl_HashEntry *entry;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 uVar6;
  undefined8 uVar5;
  char local_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char *local_20;
  long local_18;
  long local_8;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (*in_RSI == 'E') {
    local_18 = 0;
    local_8 = in_RDI;
    uVar4 = strtol(in_RSI + 1,&local_20,10);
    local_20 = local_20 + 1;
    local_18 = (**(code **)(local_8 + 0x78))(local_8 + 0x38,local_20);
    local_24 = (char)uVar4;
    cStack_23 = (char)(uVar4 >> 8);
    cStack_22 = (char)(uVar4 >> 0x10);
    cStack_21 = (char)(uVar4 >> 0x18);
    if (((local_18 != 0) && (lVar1 = *(long *)(local_18 + 0x18), lVar1 != 0)) &&
       (*(int *)(lVar1 + 8) != (int)uVar4)) {
      printf("Warning:  Atom use inconsistency.\n");
      uVar5 = CONCAT44(uVar6,(int)*(char *)(lVar1 + 0xb));
      printf("\tThis program associates the string \"%s\" with atom value %d, %x, \'%c%c%c%c\'\n",
             local_20,(ulong)*(uint *)(lVar1 + 8),(ulong)*(uint *)(lVar1 + 8),
             (ulong)(uint)(int)*(char *)(lVar1 + 8),(ulong)(uint)(int)*(char *)(lVar1 + 9),
             (int)*(char *)(lVar1 + 10),uVar5);
      uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
      printf("\tOther programs use the atom value %d, %x, \'%c%c%c%c\'\n",uVar4 & 0xffffffff,
             uVar4 & 0xffffffff,(ulong)(uint)(int)local_24,(ulong)(uint)(int)cStack_23,
             (ulong)(uint)(int)cStack_22,(int)cStack_21);
    }
    local_18 = (**(code **)(local_8 + 200))(local_8 + 0x88,(long)(int)uVar4);
    if (local_18 != 0) {
      puVar2 = *(undefined8 **)(local_18 + 0x18);
      if ((puVar2 != (undefined8 *)0x0) && (iVar3 = strcmp((char *)*puVar2,local_20), iVar3 != 0)) {
        printf("Warning:  Atom use inconsistency.\n");
        printf("\tThis program associates the string \"%s\" with atom value %d, %x, \'%c%c%c%c\'\n",
               *puVar2,(ulong)*(uint *)(puVar2 + 1),(ulong)*(uint *)(puVar2 + 1),
               (ulong)(uint)(int)*(char *)(puVar2 + 1),(ulong)(uint)(int)*(char *)((long)puVar2 + 9)
               ,(int)*(char *)((long)puVar2 + 10),CONCAT44(uVar6,(int)*(char *)((long)puVar2 + 0xb))
              );
        printf("\tOther programs associate the string \"%s\" with that value\n",local_20);
      }
      printf("Atom cache inconsistency, tried to associate value %d %x, \'%c%c%c%c\' with string \"%s\"\n\tPrevious association was string \"%s\"\n"
             ,uVar4 & 0xffffffff,uVar4 & 0xffffffff,(ulong)(uint)(int)local_24,
             (ulong)(uint)(int)cStack_23,(ulong)(uint)(int)cStack_22,(int)cStack_21,local_20,*puVar2
            );
    }
  }
  else {
    printf("Warning: Got an unexpected message \"%s\"\n",in_RSI);
  }
  return;
}

Assistant:

static void
handle_unexpected_msg(atom_server as, char *msg)
{
    switch (msg[0]) {
    case 'E':{
	    Tcl_HashEntry *entry = NULL;
	    char *str;
	    int atom;
	    atom = strtol(&msg[1], &str, 10);
	    str++;
	    entry = Tcl_FindHashEntry(&as->string_hash_table, str);
	    if (entry != NULL) {
		send_get_atom_msg_ptr atom_entry =
		(send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
		if ((atom_entry != NULL) && (atom_entry->atom != atom)) {
		    printf("Warning:  Atom use inconsistency.\n");
		    printf("\tThis program associates the string \"%s\" with atom value %d, %x, '%c%c%c%c'\n",
			   str, atom_entry->atom, atom_entry->atom,
			   ((char*)&atom_entry->atom)[0],
			   ((char*)&atom_entry->atom)[1],
			   ((char*)&atom_entry->atom)[2],
			   ((char*)&atom_entry->atom)[3]);
		    printf("\tOther programs use the atom value %d, %x, '%c%c%c%c'\n", atom,
			   atom, ((char*)&atom)[0], ((char*)&atom)[1], 
			((char*)&atom)[2], ((char*)&atom)[3]
			);
		}
	    }
	    entry = Tcl_FindHashEntry(&as->value_hash_table, (char *) (int64_t)atom);
	    if (entry != NULL) {
		send_get_atom_msg_ptr atom_entry =
		(send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
		if ((atom_entry != NULL) &&
		    (strcmp(atom_entry->atom_string, str) != 0)) {
		    printf("Warning:  Atom use inconsistency.\n");
		    printf("\tThis program associates the string \"%s\" with atom value %d, %x, '%c%c%c%c'\n",
			   atom_entry->atom_string, atom_entry->atom,
			   atom_entry->atom, 
			   ((char*)&atom_entry->atom)[0],
			   ((char*)&atom_entry->atom)[1],
			   ((char*)&atom_entry->atom)[2],
			   ((char*)&atom_entry->atom)[3]);
		    printf("\tOther programs associate the string \"%s\" with that value\n", str);
		}
		printf("Atom cache inconsistency, tried to associate value %d %x, '%c%c%c%c' with string \"%s\"\n	Previous association was string \"%s\"\n",
		       atom, atom, ((char*)&atom)[0], ((char*)&atom)[1], 
		       ((char*)&atom)[2], ((char*)&atom)[3], str, atom_entry->atom_string);
	    }
	    break;
	}
    default:
	printf("Warning: Got an unexpected message \"%s\"\n", msg);
    }
}